

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFPageInput.cpp
# Opt level: O3

void __thiscall
PDFPageInput::PDFPageInput
          (PDFPageInput *this,PDFParser *inParser,RefCountPtr<PDFDictionary> *inPageObject)

{
  PDFDictionary *inValue;
  
  (this->mPageObject).super_RefCountPtr<PDFDictionary>.mValue = (PDFDictionary *)0x0;
  (this->mPageObject).super_RefCountPtr<PDFDictionary>._vptr_RefCountPtr =
       (_func_int **)&PTR__RefCountPtr_003a58a0;
  this->mParser = inParser;
  inValue = PDFObjectCast<PDFDictionary>(&inPageObject->mValue->super_PDFObject);
  RefCountPtr<PDFDictionary>::operator=
            (&(this->mPageObject).super_RefCountPtr<PDFDictionary>,inValue);
  AssertPageObjectValid(this);
  return;
}

Assistant:

PDFPageInput::PDFPageInput(PDFParser* inParser,const RefCountPtr<PDFDictionary>& inPageObject)
{
    mParser = inParser;
    mPageObject = inPageObject.GetPtr();
    AssertPageObjectValid();
}